

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

int32_t ucnv_swapAliases_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                           UErrorCode *pErrorCode)

{
  ushort uVar1;
  TempRow *__src;
  UBool UVar2;
  uint16_t uVar3;
  int32_t iVar4;
  TempRow TVar5;
  uint32_t *puVar6;
  void *pvVar7;
  void *pvVar8;
  void *__dest;
  void *__dest_00;
  undefined8 in_stack_fffffffffffff318;
  undefined4 uVar9;
  uint16_t *r;
  uint16_t oldIndex;
  uint16_t *q2;
  uint16_t *q;
  uint16_t *p2;
  uint16_t *p;
  uint16_t *outTable;
  TempAliasTable tempTable;
  uint16_t resort [500];
  char local_898 [8];
  TempRow rows [500];
  uint32_t topOffset;
  uint32_t tocLength;
  uint32_t count;
  uint32_t i;
  uint32_t offsets [10];
  TempRow local_88 [2];
  uint32_t toc [10];
  uint32_t *inSectionSizes;
  uint16_t *inTable;
  int32_t headerSize;
  UDataInfo *pInfo;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffff318 >> 0x20);
  iVar4 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar2 = U_FAILURE(*pErrorCode), UVar2 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if ((((*(char *)((long)inData + 0xc) == 'C') && (*(char *)((long)inData + 0xd) == 'v')) &&
           (*(char *)((long)inData + 0xe) == 'A')) &&
          ((*(char *)((long)inData + 0xf) == 'l' && (*(char *)((long)inData + 0x10) == '\x03')))) {
    if ((length < 0) || (0x23 < length - iVar4)) {
      puVar6 = (uint32_t *)((long)inData + (long)iVar4);
      memset(local_88,0,0x28);
      rows[499] = (TempRow)(*ds->readUInt32)(*puVar6);
      local_88[0] = rows[499];
      if (((uint)rows[499] < 8) || (9 < (uint)rows[499])) {
        udata_printError_63(ds,
                            "ucnv_swapAliases(): table of contents contains unsupported number of sections (%u sections)\n"
                            ,(ulong)(uint)rows[499]);
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        ds_local._4_4_ = 0;
      }
      else {
        for (tocLength = 1; tocLength <= (uint)rows[499]; tocLength = tocLength + 1) {
          TVar5 = (TempRow)(*ds->readUInt32)(puVar6[tocLength]);
          local_88[tocLength] = TVar5;
        }
        memset(&count,0,0x28);
        i = ((int)rows[499] + 1) * 2;
        for (tocLength = 2; tocLength <= (uint)rows[499]; tocLength = tocLength + 1) {
          (&count)[tocLength] = (&count)[tocLength - 1] + (int)local_88[tocLength - 1];
        }
        rows[0x1f2] = (TempRow)((&count)[tocLength - 1] + (int)local_88[tocLength - 1]);
        if (-1 < length) {
          if (SBORROW4(length - iVar4,(int)rows[0x1f2] * 2) !=
              (length - iVar4) + (int)rows[0x1f2] * -2 < 0) {
            udata_printError_63(ds,
                                "ucnv_swapAliases(): too few bytes (%d after header) for an alias table\n"
                                ,(ulong)(uint)(length - iVar4));
            *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
          }
          pvVar7 = (void *)((long)outData + (long)iVar4);
          (*ds->swapArray32)(ds,puVar6,((int)rows[499] + 1) * 4,pvVar7,pErrorCode);
          (*ds->swapInvChars)(ds,(void *)((long)puVar6 + (ulong)offsets[6] * 2),
                              (toc[6] + toc[7]) * 2,(void *)((long)pvVar7 + (ulong)offsets[6] * 2),
                              pErrorCode);
          UVar2 = U_FAILURE(*pErrorCode);
          if (UVar2 != '\0') {
            udata_printError_63(ds,"ucnv_swapAliases().swapInvChars(charset names) failed\n");
            return 0;
          }
          if (ds->inCharset == ds->outCharset) {
            (*ds->swapArray16)(ds,(void *)((long)puVar6 + (ulong)i * 2),(offsets[6] - i) * 2,
                               (void *)((long)pvVar7 + (ulong)i * 2),pErrorCode);
          }
          else {
            outTable = (uint16_t *)((long)pvVar7 + (ulong)offsets[6] * 2);
            if (toc[1] < 0x1f5) {
              tempTable.chars = local_898;
              tempTable.rows = (TempRow *)&tempTable.stripForCompare;
            }
            else {
              tempTable.chars = (char *)uprv_malloc_63((ulong)toc[1] * 4 + (ulong)(toc[1] << 1));
              if (tempTable.chars == (char *)0x0) {
                udata_printError_63(ds,
                                    "ucnv_swapAliases(): unable to allocate memory for sorting tables (max length: %u)\n"
                                    ,(ulong)toc[1]);
                *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
                return 0;
              }
              tempTable.rows = (TempRow *)(tempTable.chars + (ulong)toc[1] * 4);
            }
            if (ds->outCharset == '\0') {
              tempTable.resort = (uint16_t *)ucnv_io_stripASCIIForCompare_63;
            }
            else {
              tempTable.resort = (uint16_t *)ucnv_io_stripEBCDICForCompare_63;
            }
            pvVar8 = (void *)((long)puVar6 + (ulong)offsets[1] * 2);
            __dest = (void *)((long)pvVar7 + (ulong)offsets[1] * 2);
            __dest_00 = (void *)((long)pvVar7 + (ulong)offsets[2] * 2);
            for (tocLength = 0; tocLength < toc[1]; tocLength = tocLength + 1) {
              uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)pvVar8 + (ulong)tocLength * 2));
              *(uint16_t *)(tempTable.chars + (ulong)tocLength * 4) = uVar3;
              *(short *)(tempTable.chars + (ulong)tocLength * 4 + 2) = (short)tocLength;
            }
            uprv_sortArray_63(tempTable.chars,toc[1],4,io_compareRows,&outTable,'\0',pErrorCode);
            UVar2 = U_SUCCESS(*pErrorCode);
            __src = tempTable.rows;
            if (UVar2 != '\0') {
              if (pvVar8 == __dest) {
                for (tocLength = 0; tocLength < toc[1]; tocLength = tocLength + 1) {
                  (*ds->swapArray16)(ds,(void *)((long)pvVar8 +
                                                (long)(int)(uint)*(ushort *)
                                                                  (tempTable.chars +
                                                                  (ulong)tocLength * 4 + 2) * 2),2,
                                     &__src->strIndex + tocLength,pErrorCode);
                }
                memcpy(__dest,__src,(ulong)toc[1] << 1);
                for (tocLength = 0; tocLength < toc[1]; tocLength = tocLength + 1) {
                  (*ds->swapArray16)(ds,(void *)((long)puVar6 +
                                                (long)(int)(uint)*(ushort *)
                                                                  (tempTable.chars +
                                                                  (ulong)tocLength * 4 + 2) * 2 +
                                                (ulong)offsets[2] * 2),2,
                                     &__src->strIndex + tocLength,pErrorCode);
                }
                memcpy(__dest_00,__src,(ulong)toc[1] << 1);
              }
              else {
                for (tocLength = 0; tocLength < toc[1]; tocLength = tocLength + 1) {
                  uVar1 = *(ushort *)(tempTable.chars + (ulong)tocLength * 4 + 2);
                  (*ds->swapArray16)(ds,(void *)((long)pvVar8 + (long)(int)(uint)uVar1 * 2),2,
                                     (void *)((long)__dest + (ulong)tocLength * 2),pErrorCode);
                  (*ds->swapArray16)(ds,(void *)((long)puVar6 +
                                                (long)(int)(uint)uVar1 * 2 + (ulong)offsets[2] * 2),
                                     2,(void *)((long)__dest_00 + (ulong)tocLength * 2),pErrorCode);
                }
              }
            }
            if (tempTable.chars != local_898) {
              uprv_free_63(tempTable.chars);
            }
            UVar2 = U_FAILURE(*pErrorCode);
            if (UVar2 != '\0') {
              udata_printError_63(ds,"ucnv_swapAliases().uprv_sortArray(%u items) failed\n",
                                  (ulong)toc[1]);
              return 0;
            }
            (*ds->swapArray16)(ds,(void *)((long)puVar6 + (ulong)i * 2),(offsets[1] - i) * 2,
                               (void *)((long)pvVar7 + (ulong)i * 2),pErrorCode);
            (*ds->swapArray16)(ds,(void *)((long)puVar6 + (ulong)offsets[3] * 2),
                               (offsets[6] - offsets[3]) * 2,
                               (void *)((long)pvVar7 + (ulong)offsets[3] * 2),pErrorCode);
          }
        }
        ds_local._4_4_ = iVar4 + (int)rows[0x1f2] * 2;
      }
    }
    else {
      udata_printError_63(ds,
                          "ucnv_swapAliases(): too few bytes (%d after header) for an alias table\n"
                          ,(ulong)(uint)(length - iVar4));
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      ds_local._4_4_ = 0;
    }
  }
  else {
    udata_printError_63(ds,
                        "ucnv_swapAliases(): data format %02x.%02x.%02x.%02x (format version %02x) is not an alias table\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd),
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        CONCAT44(uVar9,(uint)*(byte *)((long)inData + 0x10)));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_swapAliases(const UDataSwapper *ds,
                 const void *inData, int32_t length, void *outData,
                 UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint16_t *inTable;
    const uint32_t *inSectionSizes;
    uint32_t toc[offsetsCount];
    uint32_t offsets[offsetsCount]; /* 16-bit-addressed offsets from inTable/outTable */
    uint32_t i, count, tocLength, topOffset;

    TempRow rows[STACK_ROW_CAPACITY];
    uint16_t resort[STACK_ROW_CAPACITY];
    TempAliasTable tempTable;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x43 &&   /* dataFormat="CvAl" */
        pInfo->dataFormat[1]==0x76 &&
        pInfo->dataFormat[2]==0x41 &&
        pInfo->dataFormat[3]==0x6c &&
        pInfo->formatVersion[0]==3
    )) {
        udata_printError(ds, "ucnv_swapAliases(): data format %02x.%02x.%02x.%02x (format version %02x) is not an alias table\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    /* an alias table must contain at least the table of contents array */
    if(length>=0 && (length-headerSize)<4*(1+minTocLength)) {
        udata_printError(ds, "ucnv_swapAliases(): too few bytes (%d after header) for an alias table\n",
                         length-headerSize);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    inSectionSizes=(const uint32_t *)((const char *)inData+headerSize);
    inTable=(const uint16_t *)inSectionSizes;
    uprv_memset(toc, 0, sizeof(toc));
    toc[tocLengthIndex]=tocLength=ds->readUInt32(inSectionSizes[tocLengthIndex]);
    if(tocLength<minTocLength || offsetsCount<=tocLength) {
        udata_printError(ds, "ucnv_swapAliases(): table of contents contains unsupported number of sections (%u sections)\n", tocLength);
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    /* read the known part of the table of contents */
    for(i=converterListIndex; i<=tocLength; ++i) {
        toc[i]=ds->readUInt32(inSectionSizes[i]);
    }

    /* compute offsets */
    uprv_memset(offsets, 0, sizeof(offsets));
    offsets[converterListIndex]=2*(1+tocLength); /* count two 16-bit units per toc entry */
    for(i=tagListIndex; i<=tocLength; ++i) {
        offsets[i]=offsets[i-1]+toc[i-1];
    }

    /* compute the overall size of the after-header data, in numbers of 16-bit units */
    topOffset=offsets[i-1]+toc[i-1];

    if(length>=0) {
        uint16_t *outTable;
        const uint16_t *p, *p2;
        uint16_t *q, *q2;
        uint16_t oldIndex;

        if((length-headerSize)<(2*(int32_t)topOffset)) {
            udata_printError(ds, "ucnv_swapAliases(): too few bytes (%d after header) for an alias table\n",
                             length-headerSize);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        outTable=(uint16_t *)((char *)outData+headerSize);

        /* swap the entire table of contents */
        ds->swapArray32(ds, inTable, 4*(1+tocLength), outTable, pErrorCode);

        /* swap unormalized strings & normalized strings */
        ds->swapInvChars(ds, inTable+offsets[stringTableIndex], 2*(int32_t)(toc[stringTableIndex]+toc[normalizedStringTableIndex]),
                             outTable+offsets[stringTableIndex], pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "ucnv_swapAliases().swapInvChars(charset names) failed\n");
            return 0;
        }

        if(ds->inCharset==ds->outCharset) {
            /* no need to sort, just swap all 16-bit values together */
            ds->swapArray16(ds,
                            inTable+offsets[converterListIndex],
                            2*(int32_t)(offsets[stringTableIndex]-offsets[converterListIndex]),
                            outTable+offsets[converterListIndex],
                            pErrorCode);
        } else {
            /* allocate the temporary table for sorting */
            count=toc[aliasListIndex];

            tempTable.chars=(const char *)(outTable+offsets[stringTableIndex]); /* sort by outCharset */

            if(count<=STACK_ROW_CAPACITY) {
                tempTable.rows=rows;
                tempTable.resort=resort;
            } else {
                tempTable.rows=(TempRow *)uprv_malloc(count*sizeof(TempRow)+count*2);
                if(tempTable.rows==NULL) {
                    udata_printError(ds, "ucnv_swapAliases(): unable to allocate memory for sorting tables (max length: %u)\n",
                                     count);
                    *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                    return 0;
                }
                tempTable.resort=(uint16_t *)(tempTable.rows+count);
            }

            if(ds->outCharset==U_ASCII_FAMILY) {
                tempTable.stripForCompare=ucnv_io_stripASCIIForCompare;
            } else /* U_EBCDIC_FAMILY */ {
                tempTable.stripForCompare=ucnv_io_stripEBCDICForCompare;
            }

            /*
             * Sort unique aliases+mapped names.
             *
             * We need to sort the list again by outCharset strings because they
             * sort differently for different charset families.
             * First we set up a temporary table with the string indexes and
             * sorting indexes and sort that.
             * Then we permutate and copy/swap the actual values.
             */
            p=inTable+offsets[aliasListIndex];
            q=outTable+offsets[aliasListIndex];

            p2=inTable+offsets[untaggedConvArrayIndex];
            q2=outTable+offsets[untaggedConvArrayIndex];

            for(i=0; i<count; ++i) {
                tempTable.rows[i].strIndex=ds->readUInt16(p[i]);
                tempTable.rows[i].sortIndex=(uint16_t)i;
            }

            uprv_sortArray(tempTable.rows, (int32_t)count, sizeof(TempRow),
                           io_compareRows, &tempTable,
                           FALSE, pErrorCode);

            if(U_SUCCESS(*pErrorCode)) {
                /* copy/swap/permutate items */
                if(p!=q) {
                    for(i=0; i<count; ++i) {
                        oldIndex=tempTable.rows[i].sortIndex;
                        ds->swapArray16(ds, p+oldIndex, 2, q+i, pErrorCode);
                        ds->swapArray16(ds, p2+oldIndex, 2, q2+i, pErrorCode);
                    }
                } else {
                    /*
                     * If we swap in-place, then the permutation must use another
                     * temporary array (tempTable.resort)
                     * before the results are copied to the outBundle.
                     */
                    uint16_t *r=tempTable.resort;

                    for(i=0; i<count; ++i) {
                        oldIndex=tempTable.rows[i].sortIndex;
                        ds->swapArray16(ds, p+oldIndex, 2, r+i, pErrorCode);
                    }
                    uprv_memcpy(q, r, 2*(size_t)count);

                    for(i=0; i<count; ++i) {
                        oldIndex=tempTable.rows[i].sortIndex;
                        ds->swapArray16(ds, p2+oldIndex, 2, r+i, pErrorCode);
                    }
                    uprv_memcpy(q2, r, 2*(size_t)count);
                }
            }

            if(tempTable.rows!=rows) {
                uprv_free(tempTable.rows);
            }

            if(U_FAILURE(*pErrorCode)) {
                udata_printError(ds, "ucnv_swapAliases().uprv_sortArray(%u items) failed\n",
                                 count);
                return 0;
            }

            /* swap remaining 16-bit values */
            ds->swapArray16(ds,
                            inTable+offsets[converterListIndex],
                            2*(int32_t)(offsets[aliasListIndex]-offsets[converterListIndex]),
                            outTable+offsets[converterListIndex],
                            pErrorCode);
            ds->swapArray16(ds,
                            inTable+offsets[taggedAliasArrayIndex],
                            2*(int32_t)(offsets[stringTableIndex]-offsets[taggedAliasArrayIndex]),
                            outTable+offsets[taggedAliasArrayIndex],
                            pErrorCode);
        }
    }

    return headerSize+2*(int32_t)topOffset;
}